

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.cpp
# Opt level: O1

bool __thiscall mpt::layout::reset(layout *this)

{
  content<mpt::item<mpt::layout::graph>_> *pcVar1;
  bool bVar2;
  int iVar3;
  reference<mpt::content<mpt::item<mpt::layout::graph>_>_> in_RAX;
  long lVar4;
  unique_array<mpt::item<mpt::layout::graph>_> uVar5;
  unique_array<mpt::item<mpt::layout::graph>_> local_18;
  
  local_18._ref._ref =
       (reference<mpt::content<mpt::item<mpt::layout::graph>_>_>)
       (reference<mpt::content<mpt::item<mpt::layout::graph>_>_>)in_RAX._ref;
  if ((this->_parse == (parser *)0x0) ||
     (iVar3 = (*this->_parse->_vptr_parser[2])(), (char)iVar3 != '\0')) {
    unique_array<mpt::item<mpt::layout::graph>_>::unique_array(&local_18,-1);
    uVar5._ref._ref = local_18._ref._ref;
    if (local_18._ref._ref !=
        (reference<mpt::content<mpt::item<mpt::layout::graph>_>_>)
        (this->_graphs).super_unique_array<mpt::item<mpt::layout::graph>_>._ref._ref) {
      if (local_18._ref._ref == (content<mpt::item<mpt::layout::graph>_> *)0x0) {
        uVar5._ref._ref =
             (reference<mpt::content<mpt::item<mpt::layout::graph>_>_>)
             (content<mpt::item<mpt::layout::graph>_> *)0x0;
      }
      else {
        lVar4 = (**(code **)(*(long *)local_18._ref._ref + 0x10))(local_18._ref._ref);
        if (lVar4 == 0) {
          uVar5._ref._ref =
               (reference<mpt::content<mpt::item<mpt::layout::graph>_>_>)
               (content<mpt::item<mpt::layout::graph>_> *)0x0;
        }
      }
      pcVar1 = (this->_graphs).super_unique_array<mpt::item<mpt::layout::graph>_>._ref._ref;
      if (pcVar1 != (content<mpt::item<mpt::layout::graph>_> *)0x0) {
        (*(pcVar1->super_buffer)._vptr_buffer[1])();
      }
      (this->_graphs).super_unique_array<mpt::item<mpt::layout::graph>_>._ref._ref =
           (content<mpt::item<mpt::layout::graph>_> *)uVar5._ref._ref;
    }
    if (local_18._ref._ref != (content<mpt::item<mpt::layout::graph>_> *)0x0) {
      (**(code **)(*(long *)local_18._ref._ref + 8))();
    }
    (*(this->super_item_group).super_metatype.super_convertable._vptr_convertable[0x11])
              (this,0,0xffffffff);
    (*(this->super_item_group).super_metatype.super_convertable._vptr_convertable[0x10])
              (this,0,0xffffffff);
    bVar2 = true;
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool layout::reset()
{
	if (_parse && !_parse->reset()) {
		return false;
	}
	_graphs = item_array<graph>();
	set_font(0);
	set_alias(0);
	return true;
}